

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O3

long __thiscall njoy::ENDFtk::section::Type<34>::LegendreBlock::NC(LegendreBlock *this)

{
  variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>
  *pvVar1;
  variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>
  *ni;
  variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>
  *__variants;
  long result;
  long local_30;
  anon_class_8_1_6971b95b local_28;
  
  local_30 = 1;
  __variants = (this->ni_).
               super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->ni_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__variants == pvVar1) {
    local_30 = 1;
  }
  else {
    do {
      local_28.result = &local_30;
      std::
      visit<njoy::ENDFtk::section::Type<34>::LegendreBlock::NC()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::CovariancePairs,njoy::ENDFtk::section::SquareMatrix,njoy::ENDFtk::section::RectangularMatrix>const&>
                (&local_28,__variants);
      __variants = __variants + 1;
    } while (__variants != pvVar1);
  }
  return local_30;
}

Assistant:

long NC() const {

  long result = 1;

  // NI subsubsections
  for ( auto& ni : this->ni_ ) {
    std::visit( [&] ( const auto& v ) -> void
                    { result += v.NC(); },
                ni );
  }

  return result;

}